

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergePartialFromCodedStream
          (CodeGeneratorResponse *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *value;
  char *data;
  CodeGeneratorResponse_File *value_00;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  CodeGeneratorResponse *this_local;
  uint32 local_30;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_30 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_30 = input->last_tag_;
      }
      if (local_30 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_30);
      if (iVar3 != 1) break;
      WVar4 = internal::WireFormatLite::GetTagWireType(local_30);
      if (WVar4 == WIRETYPE_LENGTH_DELIMITED) {
        value = mutable_error_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,value);
        if (!bVar1) {
          return false;
        }
        error_abi_cxx11_(this);
        data = (char *)std::__cxx11::string::data();
        error_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8String(data,iVar3,PARSE);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'z')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) goto LAB_00247fac;
      }
      else {
LAB_002480f3:
        WVar4 = internal::WireFormatLite::GetTagWireType(local_30);
        if (WVar4 == WIRETYPE_END_GROUP) {
          return true;
        }
        unknown_fields = mutable_unknown_fields(this);
        bVar1 = internal::WireFormat::SkipField(input,local_30,unknown_fields);
        if (!bVar1) {
          return false;
        }
      }
    }
    if ((iVar3 != 0xf) ||
       (WVar4 = internal::WireFormatLite::GetTagWireType(local_30),
       WVar4 != WIRETYPE_LENGTH_DELIMITED)) goto LAB_002480f3;
LAB_00247fac:
    do {
      value_00 = add_file(this);
      bVar1 = internal::WireFormatLite::
              ReadMessageNoVirtual<google::protobuf::compiler::CodeGeneratorResponse_File>
                        (input,value_00);
      if (!bVar1) {
        return false;
      }
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'z')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    } while (bVar1);
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string error = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_error()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->error().data(), this->error().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        break;
      }

      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}